

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

zt_log_ty * zt_log_set_logger(zt_log_ty *log)

{
  zt_log_ty *pzVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&log_mutex);
  pzVar1 = log_default_ptr;
  log_default_ptr = log;
  pthread_mutex_unlock((pthread_mutex_t *)&log_mutex);
  return pzVar1;
}

Assistant:

static zt_log_ty *
zt_log_set_logger(zt_log_ty * log) {
    zt_log_ty   * last;

#ifdef HAVE_PTHREADS
    pthread_mutex_lock(&log_mutex);
#endif

    last = log_default_ptr;
    log_default_ptr = log;

#ifdef HAVE_PTHREADS
    pthread_mutex_unlock(&log_mutex);
#endif
    return last;
}